

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O1

uint16_t handleQuantizeEqualExp
                   (uint16_t abssrc,uint16_t tolSig,float errTol,float srcFloat,int doprint)

{
  uint16_t uVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  short sVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  
  uVar8 = (uint)abssrc;
  uVar2 = uVar8 & 0x7ff;
  uVar6 = 0xf400;
  if ((ushort)uVar2 < tolSig) {
    uVar6 = 0xe000;
  }
  if (doprint != 0) {
    puts("  === npow2 == 0x0800");
    printf("  srcMV  0x%04X %016b\n",(ulong)uVar2,(ulong)uVar2);
    printf("  mask2  0x%04X %016b\n",0xf000,0xf000);
    printf("  mask3  0x%04X %016b\n",(ulong)uVar6);
  }
  uVar2 = uVar8 - (abssrc >> 1 & 0x5555);
  uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
  uVar5 = (uVar2 >> 4) + uVar2 & 0xf0f;
  uVar5 = (uVar5 >> 8) + uVar5;
  bVar7 = (byte)uVar5;
  uVar2 = uVar5 & 0xff;
  uVar9 = uVar5 & 0xff;
  sVar11 = (short)uVar6;
  uVar6 = uVar5 & 0xff;
  fVar13 = errTol;
  if (abssrc < 0x800) {
    if (doprint != 0) {
      printf("  test0  0x%04X %016b\n",(ulong)((int)sVar11 & uVar8));
      printf("  test1  0x%04X %016b\n",0x800,0x800);
    }
    uVar12 = (int)sVar11 & uVar8;
    uVar10 = (ulong)uVar12;
    uVar2 = uVar12 >> 10;
    if ((ushort)bVar7 <= (ushort)uVar2) {
      if (((ushort)uVar2 != (ushort)bVar7) ||
         (fVar14 = srcFloat - *(float *)(_imath_half_to_float_table + uVar10 * 4), errTol <= fVar14)
         ) goto LAB_0011bce6;
LAB_0011bcdd:
      abssrc = (uint16_t)uVar12;
      fVar13 = fVar14;
      uVar6 = uVar2;
      goto LAB_0011bce6;
    }
    fVar14 = srcFloat - *(float *)(_imath_half_to_float_table + uVar10 * 4);
    if (fVar14 < errTol) {
      fVar13 = fVar14;
      abssrc = (uint16_t)uVar12;
      uVar9 = uVar2;
    }
    uVar6 = uVar9;
    if ((doprint == 0) || (errTol <= fVar14)) goto LAB_0011bce6;
  }
  else {
    if (doprint != 0) {
      printf("  test0  0x%04X %016b\n",(ulong)(uVar8 & 0x7000));
      printf("  test1  0x%04X %016b\n",(ulong)(uVar8 & 0x7800));
      printf("  xxxxx  0x%04X %016b\n",(ulong)((int)sVar11 & uVar8));
      printf("  test2  0x%04X %016b\n",(ulong)(uVar8 + 0x800 & 0xf800));
    }
    uVar12 = uVar8 & 0x7800;
    uVar9 = (int)sVar11 & uVar8;
    if ((uint16_t)(uVar8 & 0x7000) != (uint16_t)uVar12) {
      uVar9 = uVar8 & 0x7000;
    }
    uVar1 = (uint16_t)uVar9;
    uVar6 = uVar9 - (uVar9 >> 1 & 0x5555);
    uVar6 = (uVar6 >> 2 & 0x3333) + (uVar6 & 0x3333);
    uVar3 = (uVar6 >> 4) + uVar6 & 0xf0f;
    uVar3 = (uVar3 >> 8) + uVar3;
    bVar4 = (byte)uVar3;
    uVar3 = uVar3 & 0xff;
    if (bVar4 < bVar7) {
      fVar14 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar9 * 4);
      if (fVar14 < errTol) {
        fVar13 = fVar14;
        uVar2 = uVar3;
        abssrc = uVar1;
      }
      uVar6 = uVar2;
      if ((doprint != 0) && (fVar14 < errTol)) {
        printf("  smltst 0x%04X delta %g\n",(double)fVar14);
        fVar13 = fVar14;
        uVar6 = uVar3;
        abssrc = uVar1;
      }
    }
    else {
      uVar6 = uVar5 & 0xff;
      if ((bVar4 == bVar7) &&
         (fVar14 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar9 * 4),
         fVar14 < errTol)) {
        fVar13 = fVar14;
        uVar6 = uVar3;
        abssrc = uVar1;
      }
    }
    uVar2 = uVar12 - (uVar12 >> 1 & 0x1555);
    uVar2 = (uVar2 >> 2 & 0x3333) + (uVar2 & 0x3333);
    uVar2 = (uVar2 >> 4) + uVar2 & 0xf0f;
    uVar2 = (uVar2 >> 8) + uVar2 & 0xff;
    if (uVar6 <= uVar2) {
      if ((uVar6 != uVar2) ||
         (fVar14 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar12 * 4),
         fVar13 <= fVar14)) goto LAB_0011bce6;
      goto LAB_0011bcdd;
    }
    fVar14 = srcFloat - *(float *)(_imath_half_to_float_table + (ulong)uVar12 * 4);
    if (fVar14 < errTol) {
      fVar13 = fVar14;
      abssrc = (uint16_t)uVar12;
      uVar6 = uVar2;
    }
    if ((doprint == 0) || (errTol <= fVar14)) goto LAB_0011bce6;
    uVar10 = (ulong)uVar12;
  }
  printf("  smltst 0x%04X delta %g\n",(double)fVar14,uVar10);
  abssrc = (uint16_t)uVar12;
  fVar13 = fVar14;
  uVar6 = uVar2;
LAB_0011bce6:
  uVar8 = (uVar8 & 0xfffff800) + 0x800;
  uVar9 = uVar8 & 0xffff;
  uVar2 = ((uVar9 >> 0xb) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c;
  uVar1 = (uint16_t)uVar8;
  if (uVar2 < uVar6) {
    fVar13 = *(float *)(_imath_half_to_float_table + (ulong)uVar9 * 4) - srcFloat;
    if (fVar13 < errTol) {
      abssrc = uVar1;
    }
    if (doprint == 0) {
      return abssrc;
    }
    if (errTol <= fVar13) {
      return abssrc;
    }
    printf("  lrgtst 0x%04X delta %g\n",(double)fVar13);
  }
  else {
    if (uVar6 != uVar2) {
      return abssrc;
    }
    if (fVar13 <= *(float *)(_imath_half_to_float_table + (ulong)uVar9 * 4) - srcFloat) {
      return abssrc;
    }
  }
  return uVar1;
}

Assistant:

static uint16_t handleQuantizeEqualExp (
    uint16_t abssrc, uint16_t tolSig, float errTol, float srcFloat, int doprint)
{
    const uint16_t npow2 = 0x0800;
    const uint16_t lowermask = npow2 - 1;
    const uint16_t mask = ~lowermask;
    const uint16_t mask2 = mask ^ npow2;

    const uint16_t srcMaskedVal = abssrc & lowermask;
    const uint16_t extrabit = (tolSig > srcMaskedVal);

    const uint16_t mask3 = mask2 ^ (((npow2 << 1) * (extrabit)) |
                                    ((npow2 >> 1) * (!extrabit)));

    if (doprint)
    {
        printf ("  === npow2 == 0x0800\n");
        printf ("  srcMV  0x%04X %016b\n", srcMaskedVal, srcMaskedVal);
        printf ("  mask2  0x%04X %016b\n", mask2, mask2);
        printf ("  mask3  0x%04X %016b\n", mask3, mask3);
    }

    // not yet clear how to narrow down below 3 values...
    uint16_t alt, smallest = abssrc;
    int bits, smallbits = countSetBits(abssrc);
    float delta, smalldelta = errTol;

    // doing in this order mask2, mask, +npow guarantees sorting of values
    // so can avoid a couple of conditionals in the macros
    if (srcMaskedVal == abssrc)
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  test1  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
        }
        TEST_QUANT_ALTERNATE_SMALL(abssrc & mask3);
    }
    else
    {
        if (doprint)
        {
            printf ("  test0  0x%04X %016b\n", (abssrc & mask2), (abssrc & mask2));
            printf ("  test1  0x%04X %016b\n", (abssrc & mask), (abssrc & mask));
            printf ("  xxxxx  0x%04X %016b\n", (abssrc & mask3), (abssrc & mask3));
            printf ("  test2  0x%04X %016b\n", ((abssrc + npow2) & mask), ((abssrc + npow2) & mask));
        }
        uint16_t alt0 = (abssrc & mask2);
        uint16_t alt1 = (abssrc & mask);
        if (alt0 == alt1) alt0 = (abssrc & mask3);

        TEST_QUANT_ALTERNATE_SMALL(alt0);
        TEST_QUANT_ALTERNATE_SMALL(alt1);
    }
    TEST_QUANT_ALTERNATE_LARGE((abssrc + npow2) & mask);

    return smallest;
}